

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O0

void writeKeys(string *str,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *keys,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  bool bVar1;
  long lVar2;
  reference pvVar3;
  char cVar4;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  int *local_288;
  int *val_1;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  int *local_1c8;
  int *val;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  reference local_140;
  char *ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  uint8_t i_1;
  string *key_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  value_type_conflict3 local_98 [3];
  reference local_80;
  string *key;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sze;
  size_t num_chars;
  size_t n_local;
  vector<int,_std::allocator<int>_> *mapping_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_local;
  string *str_local;
  
  sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(keys);
  key = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(keys);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&key);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1,
               (value_type_conflict3 *)
               &sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    lVar2 = std::__cxx11::string::size();
    sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2);
    local_98[0] = std::__cxx11::string::size();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_98);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::to_string
            ((string *)&__range1_1,
             (unsigned_long)
             sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::operator+(&local_d8,"    static constexpr std::array<char, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
  std::operator+(&local_b8,&local_d8,"> flat_keys {\n");
  std::__cxx11::string::operator+=((string *)str,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&__range1_1);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(keys);
  key_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(keys);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&key_1);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&__end1_1);
    for (__range2._7_1_ = 0; cVar4 = (char)str, __range2._7_1_ < 8;
        __range2._7_1_ = __range2._7_1_ + 1) {
      std::__cxx11::string::push_back(cVar4);
    }
    __end2._M_current = (char *)std::__cxx11::string::begin();
    ch = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&ch);
      if (!bVar1) break;
      local_140 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2);
      std::__cxx11::string::push_back(cVar4);
      std::__cxx11::string::push_back(cVar4);
      std::__cxx11::string::push_back(cVar4);
      std::__cxx11::string::push_back(cVar4);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::push_back(cVar4);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::operator+=((string *)str,"    };\n\n");
  std::__cxx11::to_string((string *)&i,n + 1);
  std::operator+(&local_180,"    static constexpr std::array<size_t, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  std::operator+(&local_160,&local_180,"> key_start {\n        ");
  std::__cxx11::string::operator+=((string *)str,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&i);
  __range1_2 = (vector<int,_std::allocator<int>_> *)0x0;
  __end1_2 = std::vector<int,_std::allocator<int>_>::begin(mapping);
  val = (int *)std::vector<int,_std::allocator<int>_>::end(mapping);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &val);
    if (!bVar1) break;
    local_1c8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_2);
    if ((__range1_2 != (vector<int,_std::allocator<int>_> *)0x0) && ((ulong)__range1_2 % 10 == 0)) {
      std::__cxx11::string::operator+=((string *)str,"\n        ");
    }
    __range1_2 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(__range1_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    if (*local_1c8 == -1) {
      std::__cxx11::string::operator+=((string *)str,"0,");
    }
    else {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1,
                          (long)*local_1c8);
      std::__cxx11::to_string(&local_208,*pvVar3);
      std::operator+(&local_1e8,&local_208,",");
      std::__cxx11::string::operator+=((string *)str,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_2);
  }
  std::__cxx11::string::operator+=((string *)str,"\n    };\n\n");
  std::__cxx11::to_string((string *)&__range1_3,n + 1);
  std::operator+(&local_248,"    static constexpr std::array<size_t, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_3);
  std::operator+(&local_228,&local_248,"> key_size {\n        ");
  std::__cxx11::string::operator+=((string *)str,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&__range1_3);
  __range1_2 = (vector<int,_std::allocator<int>_> *)0x0;
  __end1_3 = std::vector<int,_std::allocator<int>_>::begin(mapping);
  val_1 = (int *)std::vector<int,_std::allocator<int>_>::end(mapping);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &val_1);
    if (!bVar1) break;
    local_288 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_3);
    if ((__range1_2 != (vector<int,_std::allocator<int>_> *)0x0) && ((ulong)__range1_2 % 10 == 0)) {
      std::__cxx11::string::operator+=((string *)str,"\n        ");
    }
    __range1_2 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(__range1_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    if (*local_288 == -1) {
      std::__cxx11::string::operator+=((string *)str,"0,");
    }
    else {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)*local_288);
      std::__cxx11::to_string(&local_2c8,*pvVar3);
      std::operator+(&local_2a8,&local_2c8,",");
      std::__cxx11::string::operator+=((string *)str,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_3);
  }
  std::__cxx11::string::operator+=((string *)str,"\n    };\n\n");
  std::__cxx11::string::operator+=
            ((string *)str,
             "    static inline bool checkBin(const std::string& key, size_t bin) noexcept{\n        const auto& size = key_size[bin];\n        if(size != key.size()) return false;\n        const auto& start = key_start[bin];\n        for(size_t i = size-1; i < std::numeric_limits<size_t>::max(); i--)\n            if(key[i] != flat_keys[start+i]) return false;\n        return true;\n    }\n"
            );
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<std::string>& keys,
               const std::vector<int>& mapping,
               size_t n){
    size_t num_chars = 0;
    std::vector<size_t> sze;
    std::vector<size_t> start;

    for(const std::string& key : keys){
        start.push_back(num_chars);
        num_chars += key.size();
        sze.push_back(key.size());
    }

    str += "    static constexpr std::array<char, " + std::to_string(num_chars) + "> flat_keys {\n";
    for(const std::string& key : keys){
        for(uint8_t i = 0; i < 8; i++) str.push_back(' ');
        for(const char& ch : key){
            str.push_back('\'');
            str.push_back(ch);
            str.push_back('\'');
            str.push_back(',');
        }
        str.push_back('\n');
    }
    str += "    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> key_start {\n        ";
    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(start[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> key_size {\n        ";
    i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(sze[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static inline bool checkBin(const std::string& key, size_t bin) noexcept{\n"
           "        const auto& size = key_size[bin];\n"
           "        if(size != key.size()) return false;\n"
           "        const auto& start = key_start[bin];\n"
           "        for(size_t i = size-1; i < std::numeric_limits<size_t>::max(); i--)\n"
           "            if(key[i] != flat_keys[start+i]) return false;\n"
           "        return true;\n"
           "    }\n";
}